

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Exec
          (SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *this,
          Matcher *matcher,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *inputOffset,CharCount *nextSyncInputOffset,uint8 **instPointer,
          ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  CharCount CVar1;
  bool bVar2;
  
  bVar2 = EquivScannerMixinT<4U>::Match
                    (&this->super_EquivScannerMixinT<4U>,matcher,input,inputLength,inputOffset);
  if (bVar2) {
    CVar1 = *inputOffset;
    *matchStart = CVar1;
    *inputOffset = CVar1 + (this->super_EquivScannerMixinT<4U>).super_ScannerMixin.
                           super_LiteralMixin.length;
    *instPointer = *instPointer + 0x449;
  }
  else {
    *matchStart = inputLength;
  }
  return !bVar2;
}

Assistant:

inline bool SyncToLiteralAndConsumeInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        matchStart = inputOffset;
        inputOffset += ScannerT::GetLiteralLength();
        instPointer += sizeof(*this);
        return false;
    }